

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

int HistoryItemPlayer(pyhanabi_history_item_t *item)

{
  long *in_RDI;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("item != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0xf2,"int HistoryItemPlayer(pyhanabi_history_item_t *)");
  }
  if (*in_RDI != 0) {
    return (int)*(char *)(*in_RDI + 8);
  }
  __assert_fail("item->item != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0xf3,"int HistoryItemPlayer(pyhanabi_history_item_t *)");
}

Assistant:

int HistoryItemPlayer(pyhanabi_history_item_t* item) {
  REQUIRE(item != nullptr);
  REQUIRE(item->item != nullptr);
  return reinterpret_cast<const hanabi_learning_env::HanabiHistoryItem*>(
             item->item)
      ->player;
}